

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readskel.c
# Opt level: O0

void read_skel(char *name)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char **ppcVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char *local_148;
  char *e;
  char *p;
  FILE *fp;
  int i;
  int eline;
  int sline;
  int line;
  int section;
  char buf [256];
  char *name_local;
  
  sline = -2;
  eline = 0;
  __stream = fopen(name,"r");
  bVar8 = true;
  if (__stream == (FILE *)0x0) {
    open_error(name);
  }
  while (pcVar2 = fgets((char *)&line,0xff,__stream), pcVar2 != (char *)0x0) {
    if (bVar8) {
      eline = eline + 1;
    }
    sVar3 = strlen((char *)&line);
    iVar1 = (int)sVar3;
    if (iVar1 != 0) {
      bVar7 = *(char *)((long)&line + (long)(iVar1 + -1)) != '\n';
      if (bVar7) {
        *(undefined1 *)((long)&line + (long)iVar1) = 0x5c;
        *(undefined1 *)((long)&line + (long)(iVar1 + 1)) = 0;
      }
      else {
        *(undefined1 *)((long)&line + (long)(iVar1 + -1)) = 0;
      }
      bVar7 = !bVar7;
      if (((bVar8) && ((char)line == '%')) && (line._1_1_ == '%')) {
        e = (char *)((long)&line + 2);
        if (-1 < sline) {
          ppcVar4 = fin_section();
          section_list[sline].ptr = ppcVar4;
        }
        sline = -1;
        while( true ) {
          bVar8 = false;
          if (*e != '\0') {
            ppuVar5 = __ctype_b_loc();
            bVar8 = ((*ppuVar5)[(int)*e] & 0x2000) != 0;
          }
          if (!bVar8) break;
          e = e + 1;
        }
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)*e] & 0x400) != 0) {
          local_148 = e;
          do {
            ppuVar5 = __ctype_b_loc();
            pcVar6 = local_148 + 1;
            pcVar2 = local_148 + 1;
            local_148 = pcVar6;
          } while (((*ppuVar5)[(int)*pcVar2] & 8) != 0);
          *pcVar6 = '\0';
          fp._4_4_ = 0;
          while (section_list[fp._4_4_].name != (char *)0x0) {
            iVar1 = strcmp(section_list[fp._4_4_].name,e);
            if (iVar1 == 0) {
              sline = fp._4_4_;
            }
            fp._4_4_ = fp._4_4_ + 1;
          }
        }
        if (sline < 0) {
          bVar8 = bVar7;
          if (*e != '\0') {
            error(0,(char *)&line,e,"line %d of \"%s\", bad section name",(ulong)(uint)eline,name);
          }
        }
        else {
          add_fmt("#line %d \"%s\"",(ulong)(eline + 1),name);
          bVar8 = bVar7;
        }
      }
      else {
        bVar8 = bVar7;
        if (-1 < sline) {
          add_string((char *)&line);
        }
      }
    }
  }
  if (-1 < sline) {
    ppcVar4 = fin_section();
    section_list[sline].ptr = ppcVar4;
  }
  if (sline == -2) {
    error(0,(char *)0x0,(char *)0x0,"No sections found in skeleton file \"%s\"",name);
  }
  return;
}

Assistant:

void read_skel(char *name)
{
char	buf[256];
int	section = -2;
int	line = 0, sline = 1, eline = 1;
int	i;
FILE	*fp;

    if (!(fp = fopen(name, "r")))
	open_error(name);
    while(fgets(buf, 255, fp)) {
	if ((sline = eline))
	    line++;
	if ((i = strlen(buf)) == 0)
	    continue;
	if (buf[i-1] == '\n') {
	    buf[--i] = 0;
	    eline = 1;
	} else {
	    buf[i++] = '\\';
	    buf[i] = 0;
	    eline = 0;
	}
	if (sline && buf[0] == '%' && buf[1] == '%') {
	    char *p = buf+2;
	    if (section >= 0) {
	      section_list[section].ptr = fin_section();
	    }
	    section = -1;
	    while(*p && isspace(*p)) p++;
	    if (isalpha(*p)) {
	      char *e = p;
	      while(isalnum(*++e));
	      *e = 0;
	      for (i=0; section_list[i].name; i++)
		if (!strcmp(section_list[i].name, p))
		  section = i;
	    }
	    if (section >= 0)
	      add_fmt("#line %d \"%s\"", line+1, name);
	    else if (*p)
	      error(0, buf, p, "line %d of \"%s\", bad section name",
		    line, name);
        } else if (section >= 0) {
	    add_string(buf);
	}
    }
    if (section >= 0)
	section_list[section].ptr = fin_section();
    if (section == -2)
	error(0, 0, 0, "No sections found in skeleton file \"%s\"", name);
}